

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

int flatcc_builder_init(flatcc_builder_t *B)

{
  memset(B,0,400);
  B->is_default_emitter = 1;
  B->alloc = flatcc_builder_default_alloc;
  B->emit_context = &B->default_emit_context;
  B->emit = flatcc_emitter;
  return 0;
}

Assistant:

int flatcc_builder_init(flatcc_builder_t *B)
{
    return flatcc_builder_custom_init(B, 0, 0, 0, 0);
}